

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::InvalidFunctionCall::~InvalidFunctionCall(InvalidFunctionCall *this)

{
  void *in_RDI;
  
  ~InvalidFunctionCall((InvalidFunctionCall *)0x249338);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit InvalidFunctionCall(std::string_view message = "invalid function call") noexcept:
        HelicsException(message)
    {
    }